

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_kepler.c
# Opt level: O2

int SolveProblem(ProgramArgs *args,ProblemResult *result,SUNContext sunctx)

{
  int iVar1;
  undefined8 uVar2;
  undefined2 uVar3;
  ProblemResult *pPVar4;
  int iVar5;
  int iVar6;
  N_Vector yvec;
  undefined8 *puVar7;
  void *pvVar8;
  FILE *__stream;
  FILE *pFVar9;
  int opt;
  int opt_00;
  int opt_01;
  int opt_02;
  int opt_03;
  int opt_04;
  int opt_05;
  int opt_06;
  int opt_07;
  int opt_08;
  int opt_09;
  undefined8 in_R8;
  undefined8 in_R9;
  longdouble lVar10;
  sunrealtype sVar11;
  double dVar12;
  longdouble lVar13;
  undefined4 local_24c;
  longdouble local_248;
  undefined1 local_238 [12];
  longdouble local_22c;
  int rootsfound;
  longdouble local_21c;
  void *arkode_mem;
  int local_204;
  double local_200;
  FILE *local_1f8;
  sunrealtype local_1f0;
  sunrealtype local_1e8;
  double local_1e0;
  FILE *local_1d8;
  undefined8 *local_1d0;
  undefined8 local_1c8;
  ProblemResult *local_1c0;
  double local_1b8;
  double local_1b0;
  undefined8 local_1a8;
  sunrealtype local_1a0;
  sunrealtype local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  undefined8 local_170;
  sunrealtype local_168;
  sunrealtype local_160;
  double local_158;
  double local_150;
  sunrealtype local_148;
  double local_140;
  sunrealtype tret;
  
  arkode_mem = (void *)0x0;
  rootsfound = 0;
  local_24c = 0;
  iVar6 = args->count_orbits;
  local_21c = (longdouble)CONCAT64(local_21c._4_6_,args->step_mode);
  iVar5 = args->stepper;
  iVar1 = args->use_compsums;
  local_204 = args->num_output_times;
  local_238._0_8_ = args->method_name;
  local_248 = (longdouble)CONCAT28(local_248._8_2_,args->dt);
  local_1f0 = args->tf;
  local_1c0 = result;
  puts("\n   Begin Kepler Problem\n");
  fwrite("Problem Arguments:\n",0x13,1,_stdout);
  fprintf(_stdout,"  stepper:              %d\n",(ulong)(uint)args->stepper);
  fprintf(_stdout,"  step mode:            %d\n",(ulong)(uint)args->step_mode);
  fprintf(_stdout,"  use tstop:            %d\n",(ulong)(uint)args->use_tstop);
  fprintf(_stdout,"  use compensated sums: %d\n",(ulong)(uint)args->use_compsums);
  fprintf(_stdout,"  dt:                   %Lg\n");
  fprintf(_stdout,"  Tf:                   %Lg\n");
  fprintf(_stdout,"  nout:                 %d\n\n",(ulong)(uint)args->num_output_times);
  local_1d0 = (undefined8 *)malloc(8);
  *local_1d0 = 0x3fe3333333333333;
  yvec = (N_Vector)N_VNew_Serial(4,sunctx);
  local_1c8 = N_VGetArrayPointer(yvec);
  puVar7 = (undefined8 *)N_VGetArrayPointer(yvec);
  *puVar7 = 0x3fd999999999999a;
  puVar7[1] = 0;
  puVar7[2] = 0;
  puVar7[3] = 0x4000000000000000;
  local_22c = (longdouble)CONCAT64(local_22c._4_6_,iVar5);
  if (iVar5 == 0) {
    pvVar8 = (void *)SPRKStepCreate(0,force,velocity,yvec,sunctx);
    arkode_mem = pvVar8;
    if (iVar6 != 0) {
      ARKodeRootInit(pvVar8,1,rootfn);
      iVar6 = check_retval(&local_24c,"ARKodeRootInit",opt_00);
      if (iVar6 != 0) {
        return 1;
      }
    }
    local_24c = SPRKStepSetMethodName(pvVar8,local_238._0_8_);
    iVar6 = check_retval(&local_24c,"SPRKStepSetMethodName",opt_01);
    if (iVar6 != 0) {
      return 1;
    }
    local_24c = SPRKStepSetUseCompensatedSums(pvVar8,iVar1);
    iVar6 = check_retval(&local_24c,"SPRKStepSetUseCompensatedSums",opt_02);
    if (iVar6 != 0) {
      return 1;
    }
    if (local_21c._0_4_ != 0) {
      fwrite("ERROR: adaptive time-steps are not supported with SPRKStep\n",0x3b,1,_stderr);
      return 1;
    }
    local_24c = ARKodeSetFixedStep(local_248._0_8_,pvVar8);
    iVar6 = check_retval(&local_24c,"ARKodeSetFixedStep",opt_03);
    if (iVar6 != 0) {
      return 1;
    }
    dVar12 = ceil(local_1f0 / local_248._0_8_);
    local_24c = ARKodeSetMaxNumSteps(pvVar8,(long)dVar12 + 1);
    iVar6 = check_retval(&local_24c,"ARKodeSetMaxNumSteps",opt_04);
    if (iVar6 != 0) {
      return 1;
    }
    local_24c = ARKodeSetUserData(pvVar8,local_1d0);
    iVar6 = check_retval(&local_24c,"ARKodeSetUserData",opt_05);
  }
  else {
    if (iVar5 != 1) {
      pvVar8 = (void *)0x0;
      goto LAB_001031f1;
    }
    pvVar8 = (void *)ARKStepCreate(0,dydt,0,yvec,sunctx);
    arkode_mem = pvVar8;
    local_24c = ARKStepSetTableName(pvVar8,"ARKODE_DIRK_NONE",local_238._0_8_);
    iVar5 = check_retval(&local_24c,"ARKStepSetTableName",opt);
    if (iVar5 != 0) {
      return 1;
    }
    if (iVar6 != 0) {
      ARKodeRootInit(pvVar8,1,rootfn);
      iVar6 = check_retval(&local_24c,"ARKodeRootInit",opt_06);
      if (iVar6 != 0) {
        return 1;
      }
    }
    local_24c = ARKodeSetUserData(pvVar8,local_1d0);
    iVar6 = check_retval(&local_24c,"ARKodeSetUserData",opt_07);
    if (iVar6 != 0) {
      return 1;
    }
    dVar12 = ceil(local_1f0 / local_248._0_8_);
    local_24c = ARKodeSetMaxNumSteps(pvVar8,(long)dVar12 + 1);
    iVar6 = check_retval(&local_24c,"ARKodeSetMaxNumSteps",opt_08);
    if (iVar6 != 0) {
      return 1;
    }
    if (local_21c._0_4_ == 0) {
      local_24c = ARKodeSetFixedStep(local_248._0_8_,pvVar8);
      goto LAB_001031f1;
    }
    local_24c = ARKodeSStolerances(local_248._0_8_,local_248._0_8_,pvVar8);
    iVar6 = check_retval(&local_24c,"ARKodeSStolerances",opt_09);
  }
  if (iVar6 != 0) {
    return 1;
  }
LAB_001031f1:
  uVar2 = local_238._0_8_;
  sprintf((char *)&tret,"ark_kepler_conserved_%s-dt-%.2e.txt",local_248._0_8_,local_238._0_8_);
  local_1f8 = fopen((char *)&tret,"w+");
  sprintf((char *)&tret,"ark_kepler_solution_%s-dt-%.2e.txt",local_248._0_8_,uVar2);
  __stream = fopen((char *)&tret,"w+");
  sprintf((char *)&tret,"ark_kepler_times_%s-dt-%.2e.txt",local_248._0_8_,uVar2);
  pFVar9 = fopen((char *)&tret,"w+");
  local_1e0 = local_1f0 / (double)local_204;
  tret = 0.0;
  local_200 = Hamiltonian(yvec);
  local_1e8 = AngularMomentum(yvec);
  local_140 = local_200;
  local_248 = (longdouble)local_200;
  local_238._0_10_ = (unkbyte10)local_1e8;
  local_148 = local_1e8;
  fprintf(_stdout,"t = %.4Lf, H(p,q) = %.16Lf, L(p,q) = %.16Lf\n");
  local_1d8 = pFVar9;
  fprintf(pFVar9,"%.16Lf\n");
  lVar13 = local_248;
  lVar10 = (longdouble)local_238._0_10_;
  fprintf(local_1f8,"%.16Lf, %.16Lf\n");
  N_VPrintFile(yvec,__stream);
  uVar3 = local_238._8_2_;
  local_238._0_10_ = (unkuint10)(ushort)local_238._8_2_ << 0x40;
  sVar11 = local_1e0 + 0.0;
  if (local_22c._0_4_ == 0) {
    local_238._0_10_ = (unkuint10)(ushort)uVar3 << 0x40;
    iVar6 = 0;
    while( true ) {
      local_248 = (longdouble)CONCAT28(local_248._8_2_,sVar11);
      while( true ) {
        if (local_204 <= iVar6) goto LAB_001039f8;
        if (args->use_tstop != 0) {
          ARKodeSetStopTime(local_248._0_8_,pvVar8);
          pvVar8 = arkode_mem;
          sVar11 = local_248._0_8_;
        }
        iVar5 = ARKodeEvolve(sVar11,pvVar8,yvec,&tret,1);
        pFVar9 = _stdout;
        if (iVar5 != 2) break;
        local_238._0_8_ = (double)local_238._0_8_ + 0.5;
        fwrite("ROOT RETURN:\t",0xd,1,_stdout);
        pvVar8 = arkode_mem;
        ARKodeGetRootInfo(arkode_mem,&rootsfound);
        local_1a8 = local_238._0_8_;
        fprintf(_stdout,"  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                (ulong)(uint)rootsfound);
        pFVar9 = _stdout;
        local_22c = (longdouble)tret;
        sVar11 = Hamiltonian(yvec);
        local_1b0 = sVar11 - local_200;
        local_21c = (longdouble)local_1b0;
        sVar11 = AngularMomentum(yvec);
        local_1b8 = sVar11 - local_1e8;
        fprintf(pFVar9,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
        sVar11 = local_248._0_8_;
      }
      if (iVar5 < 0) break;
      local_22c = (longdouble)tret;
      sVar11 = Hamiltonian(yvec);
      local_188 = sVar11 - local_200;
      local_21c = (longdouble)local_188;
      sVar11 = AngularMomentum(yvec);
      local_190 = sVar11 - local_1e8;
      fprintf(pFVar9,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
      fprintf(local_1d8,"%.16Lf\n");
      local_198 = Hamiltonian(yvec);
      local_22c = (longdouble)local_198;
      local_1a0 = AngularMomentum(yvec);
      fprintf(local_1f8,"%.16Lf, %.16Lf\n");
      N_VPrintFile(yvec,__stream);
      sVar11 = local_1f0;
      if (local_248._0_8_ + local_1e0 <= local_1f0) {
        sVar11 = local_248._0_8_ + local_1e0;
      }
      iVar6 = iVar6 + 1;
    }
LAB_001039d9:
    fwrite("Solver failure, stopping integration\n",0x25,1,_stderr);
  }
  else {
    iVar6 = 0;
    while (iVar6 < local_204) {
      local_248 = (longdouble)CONCAT28(local_248._8_2_,sVar11);
      if (args->use_tstop != 0) {
        ARKodeSetStopTime(sVar11,pvVar8);
        pvVar8 = arkode_mem;
        sVar11 = local_248._0_8_;
      }
      iVar5 = ARKodeEvolve(sVar11,pvVar8,yvec,&tret,1,in_R8,in_R9,lVar13,lVar10);
      pFVar9 = _stdout;
      if (iVar5 == 2) {
        local_238._0_8_ = (double)local_238._0_8_ + 0.5;
        fwrite("ROOT RETURN:\t",0xd,1,_stdout);
        pvVar8 = arkode_mem;
        ARKodeGetRootInfo(arkode_mem,&rootsfound);
        local_170 = local_238._0_8_;
        fprintf(_stdout,"  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                (ulong)(uint)rootsfound);
        pFVar9 = _stdout;
        local_22c = (longdouble)tret;
        sVar11 = Hamiltonian(yvec);
        local_178 = sVar11 - local_200;
        local_21c = (longdouble)local_178;
        sVar11 = AngularMomentum(yvec);
        local_180 = sVar11 - local_1e8;
        lVar13 = local_22c;
        lVar10 = local_21c;
        fprintf(pFVar9,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
        sVar11 = local_248._0_8_;
      }
      else {
        if (iVar5 < 0) goto LAB_001039d9;
        local_22c = (longdouble)tret;
        sVar11 = Hamiltonian(yvec);
        local_150 = sVar11 - local_200;
        local_21c = (longdouble)local_150;
        sVar11 = AngularMomentum(yvec);
        local_158 = sVar11 - local_1e8;
        fprintf(pFVar9,"t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n");
        fprintf(local_1d8,"%.16Lf\n");
        local_160 = Hamiltonian(yvec);
        local_22c = (longdouble)local_160;
        local_168 = AngularMomentum(yvec);
        lVar10 = (longdouble)local_168;
        lVar13 = local_22c;
        fprintf(local_1f8,"%.16Lf, %.16Lf\n");
        N_VPrintFile(yvec,__stream);
        sVar11 = local_1f0;
        if (local_248._0_8_ + local_1e0 <= local_1f0) {
          sVar11 = local_248._0_8_ + local_1e0;
        }
        iVar6 = iVar6 + 1;
      }
    }
  }
LAB_001039f8:
  pPVar4 = local_1c0;
  N_VScale(0x3ff0000000000000,yvec,local_1c0->sol);
  sVar11 = Hamiltonian(yvec);
  pPVar4->energy_error = sVar11 - local_200;
  free(local_1d0);
  fclose(local_1d8);
  fclose(local_1f8);
  fclose(__stream);
  N_VDestroy(yvec);
  ARKodePrintAllStats(arkode_mem,_stdout,0);
  ARKodeFree(&arkode_mem);
  return 0;
}

Assistant:

int SolveProblem(ProgramArgs* args, ProblemResult* result, SUNContext sunctx)
{
  void* arkode_mem       = NULL;
  N_Vector y             = NULL;
  SUNNonlinearSolver NLS = NULL;
  UserData udata         = NULL;
  sunrealtype* ydata     = NULL;
  sunrealtype num_orbits = 0;
  FILE* conserved_fp     = NULL;
  FILE* solution_fp      = NULL;
  FILE* times_fp         = NULL;
  int rootsfound         = 0;
  int iout               = 0;
  int retval             = 0;

  const int count_orbits     = args->count_orbits;
  const int step_mode        = args->step_mode;
  const int stepper          = args->stepper;
  const int use_compsums     = args->use_compsums;
  const int num_output_times = args->num_output_times;
  const char* method_name    = args->method_name;
  const sunrealtype dt       = args->dt;
  sunrealtype Tf             = args->tf;

  /* Default problem parameters */
  const sunrealtype T0    = SUN_RCONST(0.0);
  const sunrealtype dTout = (Tf - T0) / ((sunrealtype)num_output_times);
  const sunrealtype ecc   = SUN_RCONST(0.6);

  printf("\n   Begin Kepler Problem\n\n");
  PrintArgs(args);

  /* Allocate and fill udata structure */
  udata      = (UserData)malloc(sizeof(*udata));
  udata->ecc = ecc;

  /* Allocate our state vector */
  y     = N_VNew_Serial(4, sunctx);
  ydata = N_VGetArrayPointer(y);

  /* Fill the initial conditions */
  InitialConditions(y, ecc);

  /* Create SPRKStep integrator */
  if (stepper == 0)
  {
    arkode_mem = SPRKStepCreate(force, velocity, T0, y, sunctx);

    /* Optional: enable temporal root-finding */
    if (count_orbits)
    {
      ARKodeRootInit(arkode_mem, 1, rootfn);
      if (check_retval(&retval, "ARKodeRootInit", 1)) { return 1; }
    }

    retval = SPRKStepSetMethodName(arkode_mem, method_name);
    if (check_retval(&retval, "SPRKStepSetMethodName", 1)) { return 1; }

    retval = SPRKStepSetUseCompensatedSums(arkode_mem, use_compsums);
    if (check_retval(&retval, "SPRKStepSetUseCompensatedSums", 1)) { return 1; }

    if (step_mode == 0)
    {
      retval = ARKodeSetFixedStep(arkode_mem, dt);
      if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

      retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 1);
      if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }
    }
    else
    {
      fprintf(stderr,
              "ERROR: adaptive time-steps are not supported with SPRKStep\n");
      return 1;
    }

    retval = ARKodeSetUserData(arkode_mem, (void*)udata);
    if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }
  }
  else if (stepper == 1)
  {
    arkode_mem = ARKStepCreate(dydt, NULL, T0, y, sunctx);

    retval = ARKStepSetTableName(arkode_mem, "ARKODE_DIRK_NONE", method_name);
    if (check_retval(&retval, "ARKStepSetTableName", 1)) { return 1; }

    if (count_orbits)
    {
      ARKodeRootInit(arkode_mem, 1, rootfn);
      if (check_retval(&retval, "ARKodeRootInit", 1)) { return 1; }
    }

    retval = ARKodeSetUserData(arkode_mem, (void*)udata);
    if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }

    retval = ARKodeSetMaxNumSteps(arkode_mem, ((long int)ceil(Tf / dt)) + 1);
    if (check_retval(&retval, "ARKodeSetMaxNumSteps", 1)) { return 1; }

    if (step_mode == 0) { retval = ARKodeSetFixedStep(arkode_mem, dt); }
    else
    {
      retval = ARKodeSStolerances(arkode_mem, dt, dt);
      if (check_retval(&retval, "ARKodeSStolerances", 1)) { return 1; }
    }
  }

  /* Open output files */
  if (stepper == 0)
  {
    const char* fmt1 = "ark_kepler_conserved_%s-dt-%.2e.txt";
    const char* fmt2 = "ark_kepler_solution_%s-dt-%.2e.txt";
    const char* fmt3 = "ark_kepler_times_%s-dt-%.2e.txt";
    char fname[256];
    sprintf(fname, fmt1, method_name, dt);
    conserved_fp = fopen(fname, "w+");
    sprintf(fname, fmt2, method_name, dt);
    solution_fp = fopen(fname, "w+");
    sprintf(fname, fmt3, method_name, dt);
    times_fp = fopen(fname, "w+");
  }
  else
  {
    const char* fmt1 = "ark_kepler_conserved_%s-dt-%.2e.txt";
    const char* fmt2 = "ark_kepler_solution_%s-dt-%.2e.txt";
    const char* fmt3 = "ark_kepler_times_%s-dt-%.2e.txt";
    char fname[256];
    sprintf(fname, fmt1, method_name, dt);
    conserved_fp = fopen(fname, "w+");
    sprintf(fname, fmt2, method_name, dt);
    solution_fp = fopen(fname, "w+");
    sprintf(fname, fmt3, method_name, dt);
    times_fp = fopen(fname, "w+");
  }

  /* Print out starting energy, momentum before integrating */
  sunrealtype tret = T0;
  sunrealtype tout = T0 + dTout;
  sunrealtype H0   = Hamiltonian(y);
  sunrealtype L0   = AngularMomentum(y);
  fprintf(stdout, "t = %.4Lf, H(p,q) = %.16Lf, L(p,q) = %.16Lf\n",
          (long double)tret, (long double)H0, (long double)L0);
  fprintf(times_fp, "%.16Lf\n", (long double)tret);
  fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)H0, (long double)L0);
  N_VPrintFile(y, solution_fp);

  /* Do integration */
  if (stepper == 0)
  {
    while (iout < num_output_times)
    {
      /* Optional: if the stop time is not set, then its possible that the
         exact requested output time will not be hit (even with a fixed
         time-step due to roundoff error accumulation) and interpolation will be
         used to get the solution at the output time. */
      if (args->use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
      retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

      if (retval == ARK_ROOT_RETURN)
      {
        num_orbits += SUN_RCONST(0.5);

        fprintf(stdout, "ROOT RETURN:\t");
        ARKodeGetRootInfo(arkode_mem, &rootsfound);
        fprintf(stdout, "  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                rootsfound, (long double)ydata[0], (long double)ydata[1],
                (long double)num_orbits);
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
      }
      else if (retval >= 0)
      {
        /* Output current integration status */
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
        fprintf(times_fp, "%.16Lf\n", (long double)tret);
        fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)Hamiltonian(y),
                (long double)AngularMomentum(y));

        N_VPrintFile(y, solution_fp);

        tout += dTout;
        tout = (tout > Tf) ? Tf : tout;
        iout++;
      }
      else
      {
        fprintf(stderr, "Solver failure, stopping integration\n");
        break;
      }
    }
  }
  else
  {
    while (iout < num_output_times)
    {
      /* Optional: if the stop time is not set, then its possible that the the
         exact requested output time will not be hit (even with a fixed
         time-step due to roundoff error accumulation) and interpolation will be
         used to get the solution at the output time. */
      if (args->use_tstop) { ARKodeSetStopTime(arkode_mem, tout); }
      retval = ARKodeEvolve(arkode_mem, tout, y, &tret, ARK_NORMAL);

      if (retval == ARK_ROOT_RETURN)
      {
        num_orbits += SUN_RCONST(0.5);

        fprintf(stdout, "ROOT RETURN:\t");
        ARKodeGetRootInfo(arkode_mem, &rootsfound);
        fprintf(stdout, "  g[0] = %3d, y[0] = %3Lg, y[1] = %3Lg, num. orbits is now %.2Lf\n",
                rootsfound, (long double)ydata[0], (long double)ydata[1],
                (long double)num_orbits);
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
      }
      else if (retval >= 0)
      {
        /* Output current integration status */
        fprintf(stdout, "t = %.4Lf, H(p,q)-H0 = %.16Le, L(p,q)-L0 = %.16Le\n",
                (long double)tret, (long double)(Hamiltonian(y) - H0),
                (long double)(AngularMomentum(y) - L0));
        fprintf(times_fp, "%.16Lf\n", (long double)tret);
        fprintf(conserved_fp, "%.16Lf, %.16Lf\n", (long double)Hamiltonian(y),
                (long double)AngularMomentum(y));

        N_VPrintFile(y, solution_fp);

        tout += dTout;
        tout = (tout > Tf) ? Tf : tout;
        iout++;
      }
      else
      {
        fprintf(stderr, "Solver failure, stopping integration\n");
        break;
      }
    }
  }

  /* Copy results */
  N_VScale(SUN_RCONST(1.0), y, result->sol);
  result->energy_error = Hamiltonian(y) - H0;

  free(udata);
  fclose(times_fp);
  fclose(conserved_fp);
  fclose(solution_fp);
  if (NLS) { SUNNonlinSolFree(NLS); }
  N_VDestroy(y);
  ARKodePrintAllStats(arkode_mem, stdout, SUN_OUTPUTFORMAT_TABLE);
  ARKodeFree(&arkode_mem);
  return 0;
}